

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::DragBehaviorT<double,double,double>
               (ImGuiDataType data_type,double *v,float v_speed,double v_min,double v_max,
               char *format,ImGuiSliderFlags flags)

{
  ImGuiContext *pIVar1;
  bool bVar2;
  bool bVar3;
  uint uVar4;
  float *pfVar5;
  uint in_ECX;
  undefined8 in_RDX;
  double *in_RSI;
  float in_EDI;
  bool bVar6;
  float in_XMM0_Da;
  float fVar7;
  float fVar8;
  char *in_XMM1_Qa;
  char *in_XMM2_Qa;
  ImGuiDataType unaff_retaddr;
  float v_new_parametric_1;
  float v_new_parametric;
  float v_old_parametric;
  int decimal_precision_1;
  float zero_deadzone_halfsize;
  float logarithmic_zero_epsilon;
  double v_old_ref_for_accum_remainder;
  double v_cur;
  bool is_already_past_limits_and_pushing_outward;
  bool is_just_activated;
  float tweak_factor;
  bool tweak_fast;
  bool tweak_slow;
  int decimal_precision;
  float adjust_delta;
  bool is_floating_point;
  bool is_logarithmic;
  bool is_clamped;
  ImGuiAxis axis;
  ImGuiContext *g;
  bool local_a3;
  int in_stack_ffffffffffffff64;
  float in_stack_ffffffffffffff68;
  float in_stack_ffffffffffffff6c;
  undefined3 in_stack_ffffffffffffff74;
  ImGuiAxis IVar9;
  ImGuiAxis axis_00;
  char *local_68;
  float local_4c;
  undefined4 in_stack_ffffffffffffffc8;
  ImGuiDataType data_type_00;
  undefined4 in_stack_ffffffffffffffe8;
  ImGuiDataType in_stack_fffffffffffffffc;
  bool bVar10;
  
  pIVar1 = GImGui;
  data_type_00 = (ImGuiDataType)((ulong)in_RDX >> 0x20);
  uVar4 = (uint)((in_ECX & 0x100000) != 0);
  bVar10 = (double)in_XMM1_Qa < (double)in_XMM2_Qa;
  bVar6 = (in_ECX & 0x20) != 0;
  IVar9 = CONCAT13(1,in_stack_ffffffffffffff74);
  if (in_EDI != 1.12104e-44) {
    IVar9 = CONCAT13(in_EDI == 1.26117e-44,in_stack_ffffffffffffff74);
  }
  if ((((in_XMM0_Da == 0.0) && (!NAN(in_XMM0_Da))) && (bVar10)) &&
     ((double)in_XMM2_Qa - (double)in_XMM1_Qa < 3.4028234663852886e+38)) {
    in_XMM0_Da = (float)(((double)in_XMM2_Qa - (double)in_XMM1_Qa) *
                        (double)GImGui->DragSpeedDefaultRatio);
  }
  local_4c = 0.0;
  axis_00 = IVar9;
  if (((GImGui->ActiveIdSource == ImGuiInputSource_Mouse) &&
      (bVar2 = IsMousePosValid((ImVec2 *)0x0), bVar2)) &&
     (bVar2 = IsMouseDragPastThreshold(0,(pIVar1->IO).MouseDragThreshold * 0.5), bVar2)) {
    pfVar5 = ImVec2::operator[](&(pIVar1->IO).MouseDelta,(long)(int)uVar4);
    local_4c = *pfVar5;
    if (((pIVar1->IO).KeyAlt & 1U) != 0) {
      local_4c = local_4c * 0.01;
    }
    if (((pIVar1->IO).KeyShift & 1U) != 0) {
      local_4c = local_4c * 10.0;
    }
  }
  else if (pIVar1->ActiveIdSource == ImGuiInputSource_Nav) {
    if ((IVar9 & 0x1000000) != ImGuiAxis_X) {
      ImParseFormatPrecision
                ((char *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                 in_stack_ffffffffffffff64);
    }
    bVar2 = IsKeyDown(ImGuiKey_KeysData_OFFSET);
    bVar3 = IsKeyDown(ImGuiKey_KeysData_OFFSET);
    if (bVar2) {
      fVar7 = 1.0;
    }
    else {
      in_stack_ffffffffffffff64 = 0x3f800000;
      in_stack_ffffffffffffff68 = 10.0;
      fVar7 = in_stack_ffffffffffffff68;
      if (!bVar3) {
        in_stack_ffffffffffffff68 = 1.0;
        fVar7 = in_stack_ffffffffffffff68;
      }
    }
    in_stack_ffffffffffffff6c = fVar7;
    local_4c = GetNavTweakPressedAmount(axis_00);
    local_4c = local_4c * fVar7;
    fVar7 = GetMinimumStepAtDecimalPrecision((int)in_XMM0_Da);
    in_XMM0_Da = ImMax<float>(in_XMM0_Da,fVar7);
  }
  local_4c = in_XMM0_Da * local_4c;
  if (uVar4 == 1) {
    local_4c = -local_4c;
  }
  if (((bVar6) && ((double)in_XMM2_Qa - (double)in_XMM1_Qa < 3.4028234663852886e+38)) &&
     (9.999999974752427e-07 < (double)in_XMM2_Qa - (double)in_XMM1_Qa)) {
    local_4c = local_4c / (float)((double)in_XMM2_Qa - (double)in_XMM1_Qa);
  }
  local_a3 = false;
  if ((bVar10) && ((*in_RSI < (double)in_XMM2_Qa || (local_a3 = true, local_4c <= 0.0)))) {
    local_a3 = *in_RSI <= (double)in_XMM1_Qa && local_4c < 0.0;
  }
  if (((pIVar1->ActiveIdIsJustActivated & 1U) != 0) || (local_a3)) {
    pIVar1->DragCurrentAccum = 0.0;
    pIVar1->DragCurrentAccumDirty = false;
  }
  else if ((local_4c != 0.0) || (NAN(local_4c))) {
    pIVar1->DragCurrentAccum = local_4c + pIVar1->DragCurrentAccum;
    pIVar1->DragCurrentAccumDirty = true;
  }
  if ((pIVar1->DragCurrentAccumDirty & 1U) == 0) {
    bVar10 = false;
  }
  else {
    fVar7 = 0.0;
    if (bVar6) {
      if ((IVar9 & 0x1000000) != ImGuiAxis_X) {
        ImParseFormatPrecision
                  ((char *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                   in_stack_ffffffffffffff64);
      }
      ImPow(0.0,7.463163e-39);
      fVar7 = ScaleRatioFromValueT<double,double,double>
                        (unaff_retaddr,(double)CONCAT44(in_stack_fffffffffffffffc,in_EDI),
                         (double)in_RSI,(double)CONCAT44(in_XMM0_Da,in_stack_ffffffffffffffe8),
                         SUB81((ulong)in_XMM1_Qa >> 0x38,0),SUB84(in_XMM1_Qa,0),
                         (float)((ulong)in_XMM2_Qa >> 0x20));
      local_68 = (char *)ScaleValueFromRatioT<double,double,double>
                                   (in_stack_fffffffffffffffc,in_EDI,(double)in_RSI,
                                    (double)CONCAT44(in_XMM0_Da,in_stack_ffffffffffffffe8),
                                    SUB81((ulong)in_XMM1_Qa >> 0x38,0),SUB84(in_XMM1_Qa,0),
                                    (float)((ulong)in_XMM2_Qa >> 0x20));
    }
    else {
      local_68 = (char *)((double)pIVar1->DragCurrentAccum + *in_RSI);
    }
    if (((char)((uint)IVar9 >> 0x18) != '\0') && ((in_ECX & 0x40) == 0)) {
      local_68 = (char *)RoundScalarWithFormatT<double>
                                   (in_XMM2_Qa,data_type_00,
                                    (double)CONCAT44(in_ECX,in_stack_ffffffffffffffc8));
    }
    pIVar1->DragCurrentAccumDirty = false;
    if (bVar6) {
      fVar8 = ScaleRatioFromValueT<double,double,double>
                        (unaff_retaddr,(double)CONCAT44(in_stack_fffffffffffffffc,in_EDI),
                         (double)in_RSI,(double)CONCAT44(in_XMM0_Da,in_stack_ffffffffffffffe8),
                         SUB81((ulong)in_XMM1_Qa >> 0x38,0),SUB84(in_XMM1_Qa,0),
                         (float)((ulong)in_XMM2_Qa >> 0x20));
      pIVar1->DragCurrentAccum = pIVar1->DragCurrentAccum - (fVar8 - fVar7);
    }
    else {
      pIVar1->DragCurrentAccum = pIVar1->DragCurrentAccum - (float)((double)local_68 - *in_RSI);
    }
    if (((double)local_68 == 0.0) && (!NAN((double)local_68))) {
      local_68 = (char *)0x0;
    }
    if (((*in_RSI != (double)local_68) || (NAN(*in_RSI) || NAN((double)local_68))) && (bVar10)) {
      if (((double)local_68 < (double)in_XMM1_Qa) ||
         (((*in_RSI <= (double)local_68 && (double)local_68 != *in_RSI && (local_4c < 0.0)) &&
          ((IVar9 & 0x1000000) == ImGuiAxis_X)))) {
        local_68 = in_XMM1_Qa;
      }
      if (((double)in_XMM2_Qa < (double)local_68) ||
         ((((double)local_68 < *in_RSI && (0.0 < local_4c)) && ((IVar9 & 0x1000000) == ImGuiAxis_X))
         )) {
        local_68 = in_XMM2_Qa;
      }
    }
    if ((*in_RSI != (double)local_68) || (NAN(*in_RSI) || NAN((double)local_68))) {
      *in_RSI = (double)local_68;
      bVar10 = true;
    }
    else {
      bVar10 = false;
    }
  }
  return bVar10;
}

Assistant:

bool ImGui::DragBehaviorT(ImGuiDataType data_type, TYPE* v, float v_speed, const TYPE v_min, const TYPE v_max, const char* format, ImGuiSliderFlags flags)
{
    ImGuiContext& g = *GImGui;
    const ImGuiAxis axis = (flags & ImGuiSliderFlags_Vertical) ? ImGuiAxis_Y : ImGuiAxis_X;
    const bool is_clamped = (v_min < v_max);
    const bool is_logarithmic = (flags & ImGuiSliderFlags_Logarithmic) != 0;
    const bool is_floating_point = (data_type == ImGuiDataType_Float) || (data_type == ImGuiDataType_Double);

    // Default tweak speed
    if (v_speed == 0.0f && is_clamped && (v_max - v_min < FLT_MAX))
        v_speed = (float)((v_max - v_min) * g.DragSpeedDefaultRatio);

    // Inputs accumulates into g.DragCurrentAccum, which is flushed into the current value as soon as it makes a difference with our precision settings
    float adjust_delta = 0.0f;
    if (g.ActiveIdSource == ImGuiInputSource_Mouse && IsMousePosValid() && IsMouseDragPastThreshold(0, g.IO.MouseDragThreshold * DRAG_MOUSE_THRESHOLD_FACTOR))
    {
        adjust_delta = g.IO.MouseDelta[axis];
        if (g.IO.KeyAlt)
            adjust_delta *= 1.0f / 100.0f;
        if (g.IO.KeyShift)
            adjust_delta *= 10.0f;
    }
    else if (g.ActiveIdSource == ImGuiInputSource_Nav)
    {
        const int decimal_precision = is_floating_point ? ImParseFormatPrecision(format, 3) : 0;
        const bool tweak_slow = IsKeyDown((g.NavInputSource == ImGuiInputSource_Gamepad) ? ImGuiKey_NavGamepadTweakSlow : ImGuiKey_NavKeyboardTweakSlow);
        const bool tweak_fast = IsKeyDown((g.NavInputSource == ImGuiInputSource_Gamepad) ? ImGuiKey_NavGamepadTweakFast : ImGuiKey_NavKeyboardTweakFast);
        const float tweak_factor = tweak_slow ? 1.0f / 1.0f : tweak_fast ? 10.0f : 1.0f;
        adjust_delta = GetNavTweakPressedAmount(axis) * tweak_factor;
        v_speed = ImMax(v_speed, GetMinimumStepAtDecimalPrecision(decimal_precision));
    }
    adjust_delta *= v_speed;

    // For vertical drag we currently assume that Up=higher value (like we do with vertical sliders). This may become a parameter.
    if (axis == ImGuiAxis_Y)
        adjust_delta = -adjust_delta;

    // For logarithmic use our range is effectively 0..1 so scale the delta into that range
    if (is_logarithmic && (v_max - v_min < FLT_MAX) && ((v_max - v_min) > 0.000001f)) // Epsilon to avoid /0
        adjust_delta /= (float)(v_max - v_min);

    // Clear current value on activation
    // Avoid altering values and clamping when we are _already_ past the limits and heading in the same direction, so e.g. if range is 0..255, current value is 300 and we are pushing to the right side, keep the 300.
    bool is_just_activated = g.ActiveIdIsJustActivated;
    bool is_already_past_limits_and_pushing_outward = is_clamped && ((*v >= v_max && adjust_delta > 0.0f) || (*v <= v_min && adjust_delta < 0.0f));
    if (is_just_activated || is_already_past_limits_and_pushing_outward)
    {
        g.DragCurrentAccum = 0.0f;
        g.DragCurrentAccumDirty = false;
    }
    else if (adjust_delta != 0.0f)
    {
        g.DragCurrentAccum += adjust_delta;
        g.DragCurrentAccumDirty = true;
    }

    if (!g.DragCurrentAccumDirty)
        return false;

    TYPE v_cur = *v;
    FLOATTYPE v_old_ref_for_accum_remainder = (FLOATTYPE)0.0f;

    float logarithmic_zero_epsilon = 0.0f; // Only valid when is_logarithmic is true
    const float zero_deadzone_halfsize = 0.0f; // Drag widgets have no deadzone (as it doesn't make sense)
    if (is_logarithmic)
    {
        // When using logarithmic sliders, we need to clamp to avoid hitting zero, but our choice of clamp value greatly affects slider precision. We attempt to use the specified precision to estimate a good lower bound.
        const int decimal_precision = is_floating_point ? ImParseFormatPrecision(format, 3) : 1;
        logarithmic_zero_epsilon = ImPow(0.1f, (float)decimal_precision);

        // Convert to parametric space, apply delta, convert back
        float v_old_parametric = ScaleRatioFromValueT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, v_cur, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);
        float v_new_parametric = v_old_parametric + g.DragCurrentAccum;
        v_cur = ScaleValueFromRatioT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, v_new_parametric, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);
        v_old_ref_for_accum_remainder = v_old_parametric;
    }
    else
    {
        v_cur += (SIGNEDTYPE)g.DragCurrentAccum;
    }

    // Round to user desired precision based on format string
    if (is_floating_point && !(flags & ImGuiSliderFlags_NoRoundToFormat))
        v_cur = RoundScalarWithFormatT<TYPE>(format, data_type, v_cur);

    // Preserve remainder after rounding has been applied. This also allow slow tweaking of values.
    g.DragCurrentAccumDirty = false;
    if (is_logarithmic)
    {
        // Convert to parametric space, apply delta, convert back
        float v_new_parametric = ScaleRatioFromValueT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, v_cur, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);
        g.DragCurrentAccum -= (float)(v_new_parametric - v_old_ref_for_accum_remainder);
    }
    else
    {
        g.DragCurrentAccum -= (float)((SIGNEDTYPE)v_cur - (SIGNEDTYPE)*v);
    }

    // Lose zero sign for float/double
    if (v_cur == (TYPE)-0)
        v_cur = (TYPE)0;

    // Clamp values (+ handle overflow/wrap-around for integer types)
    if (*v != v_cur && is_clamped)
    {
        if (v_cur < v_min || (v_cur > *v && adjust_delta < 0.0f && !is_floating_point))
            v_cur = v_min;
        if (v_cur > v_max || (v_cur < *v && adjust_delta > 0.0f && !is_floating_point))
            v_cur = v_max;
    }

    // Apply result
    if (*v == v_cur)
        return false;
    *v = v_cur;
    return true;
}